

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpacePlatformAppearance.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::SpacePlatformAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SpacePlatformAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  SpacePlatformAppearance *local_18;
  SpacePlatformAppearance *this_local;
  
  local_18 = this;
  this_local = (SpacePlatformAppearance *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Space Platform Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\tPaint Scheme:           ");
  ENUMS::GetEnumAsStringPaintScheme_abi_cxx11_(&local_1d0,(ENUMS *)(ulong)((uint)*this & 1),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tMobility Kill:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 1 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tDamage:                 ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tSmoke:                  ");
  ENUMS::GetEnumAsStringEntitySmoke_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)((uint)*this >> 5 & 3),Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\n\tFlaming Effect:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0xf & 1);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x15 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tPower Plant:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x16 & 1);
  poVar1 = std::operator<<(poVar1,"\n\tState:                  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)*this >> 0x17 & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SpacePlatformAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Space Platform Appearance:"
       << "\n\tPaint Scheme:           " << GetEnumAsStringPaintScheme( m_PaintScheme )
	   << "\n\tMobility Kill:          " << m_MobilityKill       
       << "\n\tDamage:                 " << GetEnumAsStringEntityDamage( m_Damage )
       << "\n\tSmoke:                  " << GetEnumAsStringEntitySmoke( m_Smoke )
       << "\n\tFlaming Effect:         " << m_FlamingEffectField		
       << "\n\tFrozen Status:          " << m_FrozenStatus
       << "\n\tPower Plant:            " << m_PowerPlantStatus
       << "\n\tState:                  " << m_State
       << "\n";

    return ss.str();
}